

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O0

Status leveldb::WriteBatchInternal::InsertInto(WriteBatch *b,MemTable *memtable)

{
  long lVar1;
  Handler *in_RDX;
  WriteBatch *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  MemTableInserter inserter;
  MemTableInserter *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  anon_unknown_11::MemTableInserter::MemTableInserter(in_stack_ffffffffffffff98);
  Sequence((WriteBatch *)in_stack_ffffffffffffff98);
  WriteBatch::Iterate(in_RSI,in_RDX);
  anon_unknown_11::MemTableInserter::~MemTableInserter(in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status WriteBatchInternal::InsertInto(const WriteBatch* b, MemTable* memtable) {
  MemTableInserter inserter;
  inserter.sequence_ = WriteBatchInternal::Sequence(b);
  inserter.mem_ = memtable;
  return b->Iterate(&inserter);
}